

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O1

Var Js::JavascriptReflect::EntryConstruct(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Entry *instanceVar;
  Entry *instanceVar_00;
  RecyclableObject *pRVar5;
  Entry *aValue;
  Var pvVar6;
  Type typeId;
  int in_stack_00000010;
  undefined1 local_88 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo local_58;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_58 = callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != local_58._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x172,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00d12020;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])local_58;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_48,&local_58);
  args.super_Arguments.Values =
       (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  aValue = (Entry *)(((((ScriptContext *)args.super_Arguments.Values)->super_ScriptContextBase).
                     javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_88,function,local_58,L"Reflect.construct",
             &stack0x00000000);
  if (((ulong)local_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x177,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00d12020;
    *puVar4 = 0;
  }
  if ((local_48._0_4_ >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ebf5,L"Reflect.construct");
  }
  instanceVar = aValue;
  if (((ulong)local_48 & 0xfffffe) != 0) {
    instanceVar = (Entry *)Arguments::operator[]((Arguments *)local_48,1);
  }
  bVar2 = JavascriptOperators::IsConstructor(instanceVar);
  if (!bVar2) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ea05,L"target");
  }
  instanceVar_00 = instanceVar;
  if (((ulong)local_48 & 0xfffffc) != 0) {
    instanceVar_00 = (Entry *)Arguments::operator[]((Arguments *)local_48,3);
    bVar2 = JavascriptOperators::IsConstructor(instanceVar_00);
    if (!bVar2) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ea05,L"newTarget");
    }
  }
  callInfo_local = (CallInfo)VarTo<Js::RecyclableObject>(aValue);
  if (instanceVar_00 != (Entry *)0x0) {
    pRVar5 = VarTo<Js::RecyclableObject>(instanceVar_00);
    callInfo_local =
         (CallInfo)
         JavascriptOperators::CreateFromConstructor
                   (pRVar5,(ScriptContext *)args.super_Arguments.Values);
  }
  __tag.entry.next = instanceVar;
  if (2 < (local_48._0_4_ & 0xffffff)) {
    aValue = (Entry *)Arguments::operator[]((Arguments *)local_48,2);
  }
  if (aValue == (Entry *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x199,"(argArray != nullptr)","argArray != nullptr");
    if (!bVar2) goto LAB_00d12020;
    *puVar4 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00d12020;
    *puVar4 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d12020;
    *puVar4 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00d12020;
      *puVar4 = 0;
    }
    typeId = ((pRVar5->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar3 = RecyclableObject::IsExternal(pRVar5), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00d12020:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  BVar3 = JavascriptOperators::IsObjectType(typeId);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5e9dc,L"Reflect.construct");
  }
  pRVar5 = VarTo<Js::RecyclableObject>(__tag.entry.next);
  pvVar6 = JavascriptFunction::ConstructHelper
                     (pRVar5,(Var)callInfo_local,instanceVar_00,aValue,
                      (ScriptContext *)args.super_Arguments.Values);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_88);
  return pvVar6;
}

Assistant:

Var JavascriptReflect::EntryConstruct(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.construct"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.construct"));
        }

        Var target = args.Info.Count > 1 ? args[1] : undefinedValue;

        if (!JavascriptOperators::IsConstructor(target))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("target"));
        }

        Var newTarget = nullptr;
        if (args.Info.Count > 3)
        {
            newTarget = args[3];
            if (!JavascriptOperators::IsConstructor(newTarget))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("newTarget"));
            }
        }
        else
        {
            newTarget = target;
        }

        RecyclableObject* thisArg = VarTo<RecyclableObject>(undefinedValue);
        if (newTarget != nullptr)
        {
            thisArg = JavascriptOperators::CreateFromConstructor(VarTo<RecyclableObject>(newTarget), scriptContext);
        }

        Var argArray = args.Info.Count > 2 ? args[2] : undefinedValue;
        AnalysisAssert(argArray != nullptr);
        if (!(JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(argArray))))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedArrayLike, _u("Reflect.construct"));
        }

        return JavascriptFunction::ConstructHelper(VarTo<RecyclableObject>(target), thisArg, newTarget, argArray, scriptContext);
    }